

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O3

void __thiscall
Rml::ElementInstancerElement::~ElementInstancerElement(ElementInstancerElement *this)

{
  code *pcVar1;
  bool bVar2;
  Element *this_00;
  String local_40;
  
  (this->super_ElementInstancer)._vptr_ElementInstancer =
       (_func_int **)&PTR__ElementInstancerElement_0032faf0;
  if ((element_instancer_pools._8_8_ == 0) &&
     (bVar2 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar2)) {
LAB_0022b539:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (0 < *(int *)(element_instancer_pools._8_8_ + 0x20)) {
    Log::Message(LT_WARNING,"--- Found %d leaked element(s) ---");
    if ((element_instancer_pools._8_8_ == 0) &&
       (bVar2 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar2)) goto LAB_0022b539;
    this_00 = *(Element **)(element_instancer_pools._8_8_ + 0x10);
    if (this_00 != (Element *)0x0) {
      do {
        Element::GetAddress_abi_cxx11_(&local_40,this_00,false,true);
        Log::Message(LT_WARNING,"    %s",local_40._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        this_00 = (Element *)this_00[1].super_EnableObserverPtr<Rml::Element>.block;
      } while (this_00 != (Element *)0x0);
    }
    Log::Message(LT_WARNING,"------");
  }
  return;
}

Assistant:

ElementInstancerElement::~ElementInstancerElement()
{
	int num_elements = element_instancer_pools->pool_element.GetNumAllocatedObjects();
	if (num_elements > 0)
	{
		Log::Message(Log::LT_WARNING, "--- Found %d leaked element(s) ---", num_elements);

		for (auto it = element_instancer_pools->pool_element.Begin(); it; ++it)
			Log::Message(Log::LT_WARNING, "    %s", it->GetAddress().c_str());

		Log::Message(Log::LT_WARNING, "------");
	}
}